

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

ParseError *
jaegertracing::net::http::ParseError::make
          (ParseError *__return_storage_ptr__,string *expected,string *actual)

{
  ostream *poVar1;
  ostringstream oss;
  string local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Parse error, expected ",0x16);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(expected->_M_dataplus)._M_p,expected->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", encountered \"",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(actual->_M_dataplus)._M_p,actual->_M_string_length);
  local_1b8 = (string)0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1b8,1);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument
            (&__return_storage_ptr__->super_invalid_argument,&local_1b8);
  *(undefined ***)__return_storage_ptr__ = &PTR__invalid_argument_0020ff20;
  if ((undefined1 *)CONCAT71(uStack_1b7,local_1b8) != local_1a8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1b7,local_1b8));
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static ParseError make(const std::string& expected,
                           const std::string& actual)
    {
        std::ostringstream oss;
        oss << "Parse error, expected " << expected << ", encountered \""
            << actual << '"';
        return ParseError(oss.str());
    }